

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.hpp
# Opt level: O2

void __thiscall deqp::gls::LineStream::LineStream(LineStream *this,int indent)

{
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream);
  (this->m_string)._M_dataplus._M_p = (pointer)&(this->m_string).field_2;
  (this->m_string)._M_string_length = 0;
  (this->m_string).field_2._M_local_buf[0] = '\0';
  this->m_indent = indent;
  return;
}

Assistant:

LineStream		(int indent = 0)	{ m_indent = indent; }